

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Func.h
# Opt level: O2

bool __thiscall Func::CanOptimizeTryFinally(Func *this)

{
  bool bVar1;
  uint sourceContextId;
  uint functionId;
  JITTimeProfileInfo *this_00;
  
  bVar1 = JITTimeWorkItem::IsLoopBody(this->m_workItem);
  if (!bVar1) {
    sourceContextId = GetSourceContextId(this);
    functionId = GetLocalFunctionId(this);
    bVar1 = Js::Phases::IsEnabled
                      ((Phases *)&DAT_01441eb0,OptimizeTryFinallyPhase,sourceContextId,functionId);
    if (!bVar1) {
      bVar1 = HasProfileInfo(this);
      if (!bVar1) {
        return true;
      }
      this_00 = GetReadOnlyProfileInfo(this);
      bVar1 = JITTimeProfileInfo::IsOptimizeTryFinallyDisabled(this_00);
      return !bVar1;
    }
  }
  return false;
}

Assistant:

bool CanOptimizeTryFinally() const
    {
        return !this->m_workItem->IsLoopBody() && !PHASE_OFF(Js::OptimizeTryFinallyPhase, this) &&
            (!this->HasProfileInfo() || !this->GetReadOnlyProfileInfo()->IsOptimizeTryFinallyDisabled());
    }